

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *this_00;
  ulong uVar4;
  undefined4 in_register_00000034;
  undefined1 local_1bc [8];
  Binasc binasc;
  stringstream binarydata;
  ostream local_198 [376];
  istream *local_20;
  istream *input_local;
  MidiFile *this_local;
  
  local_20 = (istream *)CONCAT44(in_register_00000034,__fd);
  this->m_rwstatus = true;
  input_local = (istream *)this;
  iVar3 = std::istream::peek();
  if (iVar3 == 0x4d) {
    bVar2 = readSmf(this,local_20);
    this->m_rwstatus = bVar2;
    uVar4 = CONCAT71((int7)((ulong)this >> 8),this->m_rwstatus) & 0xffffffffffffff01;
    this_local._7_1_ = (byte)uVar4;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&binasc.m_maxLineLength);
    Binasc::Binasc((Binasc *)local_1bc);
    Binasc::writeToBinary((Binasc *)local_1bc,local_198,local_20);
    std::istream::seekg((long)&binasc.m_maxLineLength,_S_beg);
    iVar3 = std::istream::peek();
    if (iVar3 == 0x4d) {
      bVar2 = readSmf(this,(istream *)&binasc.m_maxLineLength);
      this->m_rwstatus = bVar2;
      bVar1 = this->m_rwstatus;
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cerr,"Bad MIDI data input");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      bVar1 = this->m_rwstatus;
    }
    this_local._7_1_ = bVar1 & 1;
    Binasc::~Binasc((Binasc *)local_1bc);
    uVar4 = std::__cxx11::stringstream::~stringstream((stringstream *)&binasc.m_maxLineLength);
  }
  return CONCAT71((int7)(uVar4 >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool MidiFile::read(std::istream& input) {
	m_rwstatus = true;
	if (input.peek() != 'M') {
		// If the first byte in the input stream is not 'M', then presume that
		// the MIDI file is in the binasc format which is an ASCII representation
		// of the MIDI file.  Convert the binasc content into binary content and
		// then continue reading with this function.
		std::stringstream binarydata;
		Binasc binasc;
		binasc.writeToBinary(binarydata, input);
		binarydata.seekg(0, std::ios_base::beg);
		if (binarydata.peek() != 'M') {
			std::cerr << "Bad MIDI data input" << std::endl;
			m_rwstatus = false;
			return m_rwstatus;
		} else {
			m_rwstatus = readSmf(binarydata);
			return m_rwstatus;
		}
	} else {
		m_rwstatus = readSmf(input);
		return m_rwstatus;
	}
}